

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service_client.cpp
# Opt level: O3

bool __thiscall
miniros::ServiceClient::call
          (ServiceClient *this,SerializedMessage *req,SerializedMessage *resp,string *service_md5sum
          )

{
  size_t __n;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined8 uVar1;
  undefined8 uVar2;
  size_type this_01;
  bool bVar3;
  bool bVar4;
  int iVar5;
  ServiceServerLink *__tmp;
  ServiceManagerPtr *pSVar6;
  DurationBase<miniros::WallDuration> DVar7;
  element_type *peVar8;
  ServiceServerLinkPtr link;
  undefined1 local_58 [16];
  string local_48;
  
  peVar8 = (this->impl_).
           super___shared_ptr<miniros::ServiceClient::Impl,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  __n = service_md5sum->_M_string_length;
  if ((__n != (peVar8->service_md5sum_)._M_string_length) ||
     ((__n != 0 &&
      (iVar5 = bcmp((service_md5sum->_M_dataplus)._M_p,(peVar8->service_md5sum_)._M_dataplus._M_p,
                    __n), iVar5 != 0)))) {
    if (console::g_initialized == '\0') {
      console::initialize();
    }
    if (call::loc.initialized_ == false) {
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)(local_58 + 0x10),"miniros.unknown_package","");
      console::initializeLogLocation(&call::loc,(string *)(local_58 + 0x10),Error);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
    }
    if (call::loc.level_ != Error) {
      call();
    }
    if (call::loc.logger_enabled_ == true) {
      call();
    }
    return false;
  }
  local_48._M_dataplus._M_p = (pointer)0x0;
  local_48._M_string_length = 0;
  if (peVar8->persistent_ == true) {
    DVar7 = (DurationBase<miniros::WallDuration>)
            (peVar8->server_link_).
            super___shared_ptr<miniros::ServiceServerLink,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (DVar7 == (DurationBase<miniros::WallDuration>)0x0) {
      pSVar6 = ServiceManager::instance();
      peVar8 = (this->impl_).
               super___shared_ptr<miniros::ServiceClient::Impl,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      ServiceManager::createServiceServerLink
                ((ServiceManager *)local_58,
                 (string *)
                 (pSVar6->super___shared_ptr<miniros::ServiceManager,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr,(bool)((char)peVar8 + '\x10'),(string *)(ulong)peVar8->persistent_,
                 service_md5sum,(M_string *)service_md5sum);
      uVar2 = local_58._8_8_;
      uVar1 = local_58._0_8_;
      peVar8 = (this->impl_).
               super___shared_ptr<miniros::ServiceClient::Impl,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_58._0_4_ = 0;
      local_58._4_4_ = 0;
      local_58._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      this_00 = (peVar8->server_link_).
                super___shared_ptr<miniros::ServiceServerLink,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
      (peVar8->server_link_).
      super___shared_ptr<miniros::ServiceServerLink,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)uVar1;
      (peVar8->server_link_).
      super___shared_ptr<miniros::ServiceServerLink,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar2;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_);
      }
      peVar8 = (this->impl_).
               super___shared_ptr<miniros::ServiceClient::Impl,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      DVar7 = (DurationBase<miniros::WallDuration>)
              (peVar8->server_link_).
              super___shared_ptr<miniros::ServiceServerLink,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (DVar7 == (DurationBase<miniros::WallDuration>)0x0) {
        return false;
      }
    }
    local_48._M_dataplus._M_p = (pointer)DVar7;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_48._M_string_length,
               &(peVar8->server_link_).
                super___shared_ptr<miniros::ServiceServerLink,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  else {
    pSVar6 = ServiceManager::instance();
    peVar8 = (this->impl_).
             super___shared_ptr<miniros::ServiceClient::Impl,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    ServiceManager::createServiceServerLink
              ((ServiceManager *)local_58,
               (string *)
               (pSVar6->super___shared_ptr<miniros::ServiceManager,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr,(bool)((char)peVar8 + '\x10'),(string *)(ulong)peVar8->persistent_,
               service_md5sum,(M_string *)service_md5sum);
    local_48._M_dataplus._M_p = (pointer)local_58._0_8_;
    local_48._M_string_length = local_58._8_8_;
    if ((DurationBase<miniros::WallDuration>)local_58._0_8_ ==
        (DurationBase<miniros::WallDuration>)0x0) {
      bVar3 = false;
      goto LAB_001fadc1;
    }
  }
  bVar3 = ServiceServerLink::call((ServiceServerLink *)local_48._M_dataplus._M_p,req,resp);
  this_01 = local_48._M_string_length;
  local_48._M_dataplus._M_p = (pointer)0x0;
  local_48._M_string_length = 0;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01 !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01);
  }
  while ((bVar4 = isShuttingDown(), bVar4 && (bVar4 = ok(), bVar4))) {
    local_58._0_4_ = 0;
    local_58._4_4_ = 0;
    DurationBase<miniros::WallDuration>::fromSec
              ((DurationBase<miniros::WallDuration> *)local_58,0.001);
    WallDuration::sleep((WallDuration *)local_58,(uint)req);
  }
LAB_001fadc1:
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._M_string_length);
  }
  return bVar3;
}

Assistant:

bool ServiceClient::call(const SerializedMessage& req, SerializedMessage& resp, const std::string& service_md5sum)
{
  if (service_md5sum != impl_->service_md5sum_)
  {
    MINIROS_ERROR("Call to service [%s] with md5sum [%s] does not match md5sum when the handle was created ([%s])", impl_->name_.c_str(), service_md5sum.c_str(), impl_->service_md5sum_.c_str());

    return false;
  }

  ServiceServerLinkPtr link;

  if (impl_->persistent_)
  {
    if (!impl_->server_link_)
    {
      impl_->server_link_ = ServiceManager::instance()->createServiceServerLink(impl_->name_, impl_->persistent_, service_md5sum, service_md5sum, impl_->header_values_);

      if (!impl_->server_link_)
      {
        return false;
      }
    }

    link = impl_->server_link_;
  }
  else
  {
    link = ServiceManager::instance()->createServiceServerLink(impl_->name_, impl_->persistent_, service_md5sum, service_md5sum, impl_->header_values_);

    if (!link)
    {
      return false;
    }
  }

  bool ret = link->call(req, resp);
  link.reset();

  // If we're shutting down but the node haven't finished yet, wait until we do
  while (miniros::isShuttingDown() && miniros::ok())
  {
    miniros::WallDuration(0.001).sleep();
  }

  return ret;
}